

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QDBusSignature>::pop_front(QList<QDBusSignature> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QDBusSignature>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QDBusSignature> *)0x0);
  }
  QtPrivate::QGenericArrayOps<QDBusSignature>::eraseFirst((QGenericArrayOps<QDBusSignature> *)this);
  return;
}

Assistant:

void pop_front() noexcept { removeFirst(); }